

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledVertical.cpp
# Opt level: O0

SharedPtr<Decorator> __thiscall
Rml::DecoratorTiledVerticalInstancer::InstanceDecorator
          (DecoratorTiledVerticalInstancer *this,String *param_1,PropertyDictionary *properties,
          DecoratorInstancerInterface *instancer_interface)

{
  bool bVar1;
  element_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  DecoratorInstancerInterface *in_R8;
  SharedPtr<Decorator> SVar3;
  Texture *local_1b0;
  Tile *local_180;
  undefined1 local_168 [8];
  SharedPtr<Rml::DecoratorTiledVertical> decorator;
  Texture textures [3];
  Tile tiles [3];
  size_t num_tiles;
  DecoratorInstancerInterface *instancer_interface_local;
  PropertyDictionary *properties_local;
  String *param_1_local;
  DecoratorTiledVerticalInstancer *this_local;
  
  local_180 = (Tile *)&textures[2].file_index;
  do {
    DecoratorTiled::Tile::Tile(local_180);
    local_180 = local_180 + 1;
  } while (local_180 != (Tile *)(tiles[2].align + 1));
  local_1b0 = (Texture *)
              &decorator.super___shared_ptr<Rml::DecoratorTiledVertical,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount;
  do {
    Texture::Texture(local_1b0);
    local_1b0 = local_1b0 + 1;
  } while (local_1b0 != (Texture *)&textures[2].file_index);
  bVar1 = DecoratorTiledInstancer::GetTileProperties
                    ((DecoratorTiledInstancer *)param_1,(Tile *)&textures[2].file_index,
                     (Texture *)
                     &decorator.
                      super___shared_ptr<Rml::DecoratorTiledVertical,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,3,(PropertyDictionary *)instancer_interface,in_R8);
  if (bVar1) {
    MakeShared<Rml::DecoratorTiledVertical>();
    this_00 = ::std::
              __shared_ptr_access<Rml::DecoratorTiledVertical,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Rml::DecoratorTiledVertical,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_168);
    bVar1 = DecoratorTiledVertical::Initialise
                      (this_00,(Tile *)&textures[2].file_index,
                       (Texture *)
                       &decorator.
                        super___shared_ptr<Rml::DecoratorTiledVertical,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    if (bVar1) {
      ::std::shared_ptr<Rml::Decorator>::shared_ptr<Rml::DecoratorTiledVertical,void>
                ((shared_ptr<Rml::Decorator> *)this,
                 (shared_ptr<Rml::DecoratorTiledVertical> *)local_168);
    }
    else {
      ::std::shared_ptr<Rml::Decorator>::shared_ptr
                ((shared_ptr<Rml::Decorator> *)this,(nullptr_t)0x0);
    }
    ::std::shared_ptr<Rml::DecoratorTiledVertical>::~shared_ptr
              ((shared_ptr<Rml::DecoratorTiledVertical> *)local_168);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    ::std::shared_ptr<Rml::Decorator>::shared_ptr((shared_ptr<Rml::Decorator> *)this,(nullptr_t)0x0)
    ;
    _Var2._M_pi = extraout_RDX;
  }
  SVar3.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  SVar3.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SharedPtr<Decorator>)SVar3.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Decorator> DecoratorTiledVerticalInstancer::InstanceDecorator(const String& /*name*/, const PropertyDictionary& properties,
	const DecoratorInstancerInterface& instancer_interface)
{
	constexpr size_t num_tiles = 3;

	DecoratorTiled::Tile tiles[num_tiles];
	Texture textures[num_tiles];

	if (!GetTileProperties(tiles, textures, num_tiles, properties, instancer_interface))
		return nullptr;

	auto decorator = MakeShared<DecoratorTiledVertical>();
	if (!decorator->Initialise(tiles, textures))
		return nullptr;

	return decorator;
}